

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  string user_msg_string;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Message::GetString_abi_cxx11_(&sStack_58,user_msg);
  if (sStack_58._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)gtest_msg);
  }
  else {
    std::operator+(&local_38,gtest_msg,"\n");
    std::operator+(__return_storage_ptr__,&local_38,&sStack_58);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  return gtest_msg + "\n" + user_msg_string;
}